

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O2

void Joy_GenerateButtonEvents(int oldbuttons,int newbuttons,int numbuttons,int base)

{
  uint uVar1;
  bool bVar2;
  event_t ev;
  
  if (oldbuttons != newbuttons) {
    ev.type = '\0';
    ev.subtype = '\0';
    ev.data1 = 0;
    ev.data2 = 0;
    ev.data3 = 0;
    ev.x = 0;
    ev.y = 0;
    if (numbuttons < 1) {
      numbuttons = 0;
    }
    uVar1 = 1;
    while (bVar2 = numbuttons != 0, numbuttons = numbuttons + -1, bVar2) {
      if ((uVar1 & (oldbuttons ^ newbuttons)) != 0) {
        ev.data1 = (SWORD)base;
        ev.type = ((uVar1 & newbuttons) == 0) + '\x01';
        D_PostEvent(&ev);
      }
      uVar1 = uVar1 * 2;
      base = base + 1;
    }
  }
  return;
}

Assistant:

void Joy_GenerateButtonEvents(int oldbuttons, int newbuttons, int numbuttons, int base)
{
	int changed = oldbuttons ^ newbuttons;
	if (changed != 0)
	{
		event_t ev = { 0, 0, 0, 0, 0, 0, 0 };
		int mask = 1;
		for (int j = 0; j < numbuttons; mask <<= 1, ++j)
		{
			if (changed & mask)
			{
				ev.data1 = base + j;
				ev.type = (newbuttons & mask) ? EV_KeyDown : EV_KeyUp;
				D_PostEvent(&ev);
			}
		}
	}
}